

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O0

int st__lookup_int(st__table *table,char *key,int *value)

{
  int iVar1;
  bool bVar2;
  int local_48;
  int local_44;
  st__table_entry **local_40;
  st__table_entry **last;
  st__table_entry *ptr;
  int hash_val;
  int *value_local;
  char *key_local;
  st__table *table_local;
  
  if (table->hash == st__ptrhash) {
    local_44 = (int)(((ulong)key >> 2) % (ulong)(long)table->num_bins);
  }
  else {
    if (table->hash == st__numhash) {
      local_48 = Abc_AbsInt((int)key);
      local_48 = local_48 % table->num_bins;
    }
    else {
      local_48 = (*table->hash)(key,table->num_bins);
    }
    local_44 = local_48;
  }
  local_40 = table->bins + local_44;
  last = (st__table_entry **)*local_40;
  while( true ) {
    bVar2 = false;
    if (last != (st__table_entry **)0x0) {
      if ((table->compare == st__numcmp) || (table->compare == st__ptrcmp)) {
        bVar2 = (st__table_entry *)key == *last;
      }
      else {
        iVar1 = (*table->compare)(key,(char *)*last);
        bVar2 = iVar1 == 0;
      }
      bVar2 = !bVar2;
    }
    if (!bVar2) break;
    local_40 = last + 2;
    last = (st__table_entry **)*local_40;
  }
  if ((last != (st__table_entry **)0x0) && (table->reorder_flag != 0)) {
    *local_40 = last[2];
    last[2] = table->bins[local_44];
    table->bins[local_44] = (st__table_entry *)last;
  }
  if (last == (st__table_entry **)0x0) {
    table_local._4_4_ = 0;
  }
  else {
    if (value != (int *)0x0) {
      *value = (int)last[1];
    }
    table_local._4_4_ = 1;
  }
  return table_local._4_4_;
}

Assistant:

int
 st__lookup_int( st__table *table, char *key, int *value)
{
    int hash_val;
    st__table_entry *ptr, **last;

    hash_val = do_hash(key, table);

    FIND_ENTRY(table, hash_val, key, ptr, last);
    
    if (ptr == NULL) {
    return 0;
    } else {
    if (value != 0) {
        *value = (long) ptr->record;
    }
    return 1;
    }
}